

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

StringPtr __thiscall capnp::compiler::CompilerMain::toString(CompilerMain *this,Format format)

{
  StringPtr SVar1;
  
  if (format < (JSON|PACKED)) {
    SVar1.content.ptr = &DAT_0028cca8 + *(int *)(&DAT_0028cca8 + (ulong)format * 4);
    SVar1.content.size_ = *(size_t *)(&DAT_0028cc70 + (ulong)format * 8);
    return (StringPtr)SVar1.content;
  }
  kj::_::unreachable();
}

Assistant:

kj::StringPtr toString(Format format) {
    switch (format) {
      case Format::BINARY     : return "binary";
      case Format::PACKED     : return "packed";
      case Format::FLAT       : return "flat";
      case Format::FLAT_PACKED: return "flat-packed";
      case Format::CANONICAL  : return "canonical";
      case Format::TEXT       : return "text";
      case Format::JSON       : return "json";
    }
    KJ_UNREACHABLE;
  }